

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  undefined8 uVar1;
  xml_attribute_struct *pxVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  xpath_node *it;
  xpath_node *pxVar5;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar6;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  long lVar7;
  xpath_node *pxVar8;
  xpath_node *end_00;
  long lVar9;
  ulong uVar10;
  xpath_node *pxVar11;
  long lVar12;
  xml_node_struct *local_78;
  xml_attribute_struct *pxStack_70;
  xpath_node *local_60;
  xpath_node *local_58;
  long local_50;
  xpath_node local_48;
  
LAB_00110f22:
  local_58 = end + -1;
LAB_00110f30:
  uVar10 = (long)end - (long)begin >> 4;
  if (0x10 < (long)uVar10) {
    pxVar5 = begin + (uVar10 >> 1);
    bVar4 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar5,begin,(xpath_node *)pred);
    pxVar8 = local_58;
    pxVar11 = pxVar5;
    pxVar6 = begin;
    if (bVar4) {
      pxVar11 = begin;
      pxVar6 = pxVar5;
    }
    bVar4 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)local_58,pxVar11,rhs);
    if (bVar4) {
      pxVar11 = pxVar8;
    }
    bVar4 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar11,pxVar6,rhs_00);
    if (bVar4) {
      pxVar11 = pxVar6;
    }
    local_50 = -(long)begin;
    lVar9 = 0;
    local_48._node._root = (pxVar11->_node)._root;
    local_48._attribute._attr = (pxVar11->_attribute)._attr;
    pxVar6 = extraout_RDX;
    pxVar8 = begin;
    pxVar11 = end;
    local_60 = begin;
LAB_00110fb2:
    do {
      lVar7 = (long)end - (long)pxVar11;
      lVar12 = (long)&(pxVar11->_node)._root + local_50;
      while( true ) {
        pxVar5 = begin;
        end_00 = pxVar11;
        if (pxVar11 <= pxVar8) goto LAB_0011106c;
        bVar4 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)pxVar8,&local_48,pxVar6);
        pxVar6 = extraout_RDX_00;
        if (bVar4) {
          pxVar8 = pxVar8 + 1;
          goto LAB_00110fb2;
        }
        auVar3._8_8_ = local_48._attribute._attr;
        auVar3._0_8_ = local_48._node._root;
        uVar1 = vpcmpeqq_avx512vl(auVar3,(undefined1  [16])*pxVar8);
        if (((byte)uVar1 & 3) == 3) break;
        local_78 = (pxVar8->_node)._root;
        pxStack_70 = (pxVar8->_attribute)._attr;
        lVar7 = lVar7 + 0x10;
        lVar12 = lVar12 + -0x10;
        pxVar2 = pxVar11[-1]._attribute._attr;
        (pxVar8->_node)._root = pxVar11[-1]._node._root;
        (pxVar8->_attribute)._attr = pxVar2;
        pxVar11[-1]._node._root = local_78;
        pxVar11[-1]._attribute._attr = pxStack_70;
        pxVar11 = pxVar11 + -1;
      }
      lVar9 = lVar9 + 0x10;
      local_78 = (local_60->_node)._root;
      pxStack_70 = (local_60->_attribute)._attr;
      pxVar2 = (pxVar8->_attribute)._attr;
      (local_60->_node)._root = (pxVar8->_node)._root;
      (local_60->_attribute)._attr = pxVar2;
      local_60 = local_60 + 1;
      (pxVar8->_node)._root = local_78;
      (pxVar8->_attribute)._attr = pxStack_70;
      pxVar8 = pxVar8 + 1;
    } while( true );
  }
  if (begin == end) {
    return;
  }
  pxVar6 = begin;
  goto LAB_001110e3;
LAB_0011106c:
  for (; lVar9 != 0; lVar9 = lVar9 + -0x10) {
    local_78 = (pxVar5->_node)._root;
    pxStack_70 = (pxVar5->_attribute)._attr;
    lVar12 = lVar12 + -0x10;
    pxVar2 = end_00[-1]._attribute._attr;
    (pxVar5->_node)._root = end_00[-1]._node._root;
    (pxVar5->_attribute)._attr = pxVar2;
    end_00[-1]._node._root = local_78;
    end_00[-1]._attribute._attr = pxStack_70;
    pxVar5 = pxVar5 + 1;
    end_00 = end_00 + -1;
  }
  if (lVar7 < lVar12) goto LAB_001110be;
  sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (begin,end_00,(document_order_comparator *)pxVar6);
  pred = (document_order_comparator *)extraout_RDX_01;
  begin = pxVar11;
  goto LAB_00110f30;
LAB_001110be:
  sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (pxVar11,end,(document_order_comparator *)pxVar6);
  pred = (document_order_comparator *)extraout_RDX_02;
  end = end_00;
  goto LAB_00110f22;
LAB_001110e3:
  pxVar8 = pxVar6 + 1;
  if (pxVar8 == end) {
    return;
  }
  local_78 = (pxVar8->_node)._root;
  pxStack_70 = pxVar6[1]._attribute._attr;
  pxVar6 = pxVar8;
  while (begin < pxVar6) {
    pxVar11 = pxVar6 + -1;
    bVar4 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)&local_78,pxVar11,(xpath_node *)pred);
    pred = (document_order_comparator *)extraout_RDX_03;
    if (!bVar4) break;
    pxVar2 = pxVar6[-1]._attribute._attr;
    (pxVar6->_node)._root = (pxVar11->_node)._root;
    (pxVar6->_attribute)._attr = pxVar2;
    pxVar6 = pxVar11;
  }
  (pxVar6->_node)._root = local_78;
  (pxVar6->_attribute)._attr = pxStack_70;
  pxVar6 = pxVar8;
  goto LAB_001110e3;
}

Assistant:

PUGI__FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}